

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitConstantArgsToIntArray
               (ByteCodeGenerator *byteCodeGenerator,int32 *vars,ParseNode *args,uint argCount)

{
  code *pcVar1;
  bool bVar2;
  ParseNodeBin *pPVar3;
  undefined4 *puVar4;
  ParseNodeInt *pPVar5;
  uint local_28;
  uint index;
  uint argCount_local;
  ParseNode *args_local;
  int32 *vars_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  
  local_28 = 0;
  _index = args;
  do {
    if (_index->nop != knopList || argCount <= local_28) {
      if (argCount <= local_28) {
        Js::Throw::InternalError();
      }
      if (_index->nop != knopInt) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1e59,"(args->nop == knopInt)","args->nop == knopInt");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pPVar5 = ParseNode::AsParseNodeInt(_index);
      vars[local_28] = pPVar5->lw;
      if (local_28 + 1 != argCount) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1e5c,"(index == argCount)","index == argCount");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      return;
    }
    pPVar3 = ParseNode::AsParseNodeBin(_index);
    if (pPVar3->pnode1->nop != knopInt) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1e4e,"(args->AsParseNodeBin()->pnode1->nop == knopInt)",
                         "args->AsParseNodeBin()->pnode1->nop == knopInt");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pPVar3 = ParseNode::AsParseNodeBin(_index);
    pPVar5 = ParseNode::AsParseNodeInt(pPVar3->pnode1);
    vars[local_28] = pPVar5->lw;
    pPVar3 = ParseNode::AsParseNodeBin(_index);
    _index = pPVar3->pnode2;
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void EmitConstantArgsToIntArray(ByteCodeGenerator *byteCodeGenerator, __out_ecount(argCount) int32 *vars, ParseNode *args, uint argCount)
{
    uint index = 0;
    while (args->nop == knopList && index < argCount)
    {
        Assert(args->AsParseNodeBin()->pnode1->nop == knopInt);
        vars[index++] = args->AsParseNodeBin()->pnode1->AsParseNodeInt()->lw;
        args = args->AsParseNodeBin()->pnode2;
    }

    if (index >= argCount)
    {
        Js::Throw::InternalError();
        return;
    }

    Assert(args->nop == knopInt);
    vars[index++] = args->AsParseNodeInt()->lw;

    Assert(index == argCount);
}